

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
* get_primes<libdivide::divider<unsigned_short,(libdivide::Branching)0>,unsigned_short>
            (unsigned_short max)

{
  short sVar1;
  vector<char,_std::allocator<char>_> *this;
  reference pvVar2;
  ushort in_SI;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t i_1;
  size_t j;
  size_t i;
  vector<char,_std::allocator<char>_> sieve;
  size_t n;
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  *primes;
  uint16_t twice_rem;
  uint16_t e;
  uint16_t proposed_m;
  uint16_t rem;
  uint8_t more;
  uint8_t floor_log_2_d;
  libdivide_u16_t result;
  uint16_t result_1;
  uint32_t n_1;
  value_type *in_stack_fffffffffffffef8;
  allocator_type *in_stack_ffffffffffffff08;
  vector<char,_std::allocator<char>_> *__n;
  short local_cb;
  byte local_c9;
  size_type local_c8;
  undefined1 local_b9;
  size_type local_b8;
  size_type local_b0;
  allocator<char> local_92;
  undefined1 local_91;
  vector<char,_std::allocator<char>_> local_90;
  ulong local_78;
  ushort local_5a;
  short *local_58;
  ushort local_4a;
  short *local_48;
  uint3 local_40;
  ushort local_3a;
  short local_37;
  byte local_35;
  undefined1 local_34 [6];
  ushort local_2e;
  ushort local_2c;
  short local_2a;
  undefined1 local_28 [2];
  byte local_26;
  byte local_25;
  undefined4 local_24;
  ushort local_1e;
  short local_1b;
  byte local_19;
  ushort local_18;
  short local_16;
  uint local_14;
  undefined1 *local_10;
  ushort local_6;
  uint local_4;
  
  local_78 = (ulong)in_SI;
  this = (vector<char,_std::allocator<char>_> *)(local_78 + 1);
  local_91 = 1;
  __n = in_RDI;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (this,(size_type)__n,(value_type *)in_RDI,in_stack_ffffffffffffff08);
  std::allocator<char>::~allocator(&local_92);
  for (local_b0 = 2; local_b0 * local_b0 < local_78 || local_b0 * local_b0 - local_78 == 0;
      local_b0 = local_b0 + 1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,local_b0);
    if (*pvVar2 != '\0') {
      for (local_b8 = local_b0 * local_b0; local_b8 <= local_78; local_b8 = local_b0 + local_b8) {
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,local_b8);
        *pvVar2 = '\0';
      }
    }
  }
  local_b9 = 0;
  std::
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  ::vector((vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
            *)0x10546b);
  local_c8 = 2;
  do {
    if (local_78 < local_c8) {
      local_b9 = 1;
      std::vector<char,_std::allocator<char>_>::~vector(in_RDI);
      return (vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
              *)__n;
    }
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,local_c8);
    if (*pvVar2 != '\0') {
      local_58 = &local_cb;
      local_5a = (ushort)local_c8;
      local_24 = 0;
      local_4a = local_5a;
      local_48 = local_58;
      local_3a = local_5a;
      local_1e = local_5a;
      if (local_5a == 0) {
        fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x307,"libdivide_internal_u16_gen",
                "divider must be != 0");
        abort();
      }
      local_25 = 0xf - ((char)LZCOUNT((uint)local_5a) + -0x10);
      if ((local_5a & local_5a - 1) == 0) {
        local_1b = 0;
        local_19 = local_25;
      }
      else {
        local_4 = (1 << (local_25 & 0x1f)) << 0x10;
        local_10 = local_28;
        local_14 = local_4;
        local_16 = (short)(local_4 / local_5a);
        sVar1 = local_16 * local_5a;
        local_2c = local_5a + sVar1;
        local_2a = local_16;
        local_26 = local_25;
        if (1 << (local_25 & 0x1f) <= (int)(uint)local_2c) {
          local_2a = local_16 * 2;
          local_2e = sVar1 * -2;
          if ((local_5a <= local_2e) || (local_2e < (ushort)-sVar1)) {
            local_2a = local_2a + 1;
          }
          local_26 = local_25 | 0x40;
        }
        local_1b = local_2a + 1;
        local_19 = local_26;
        local_6 = local_5a;
      }
      local_34[2] = local_19;
      local_34._0_2_ = local_1b;
      local_37 = local_1b;
      local_35 = local_19;
      local_40 = CONCAT12(local_19,local_1b);
      local_cb = local_1b;
      local_c9 = local_19;
      local_18 = local_5a;
      std::
      vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
      ::push_back((vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
                   *)(ulong)CONCAT34(local_34._0_3_,(uint)local_40),in_stack_fffffffffffffef8);
    }
    local_c8 = local_c8 + 1;
  } while( true );
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}